

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerReflection::emit_resources(CompilerReflection *this)

{
  ShaderResources res;
  ShaderResources SStack_1a08;
  
  Compiler::get_shader_resources(&SStack_1a08,(Compiler *)this);
  emit_resources(this,"subpass_inputs",&SStack_1a08.subpass_inputs);
  emit_resources(this,"inputs",&SStack_1a08.stage_inputs);
  emit_resources(this,"outputs",&SStack_1a08.stage_outputs);
  emit_resources(this,"textures",&SStack_1a08.sampled_images);
  emit_resources(this,"separate_images",&SStack_1a08.separate_images);
  emit_resources(this,"separate_samplers",&SStack_1a08.separate_samplers);
  emit_resources(this,"images",&SStack_1a08.storage_images);
  emit_resources(this,"ssbos",&SStack_1a08.storage_buffers);
  emit_resources(this,"ubos",&SStack_1a08.uniform_buffers);
  emit_resources(this,"push_constants",&SStack_1a08.push_constant_buffers);
  emit_resources(this,"counters",&SStack_1a08.atomic_counters);
  emit_resources(this,"acceleration_structures",&SStack_1a08.acceleration_structures);
  ShaderResources::~ShaderResources(&SStack_1a08);
  return;
}

Assistant:

void CompilerReflection::emit_resources()
{
	auto res = get_shader_resources();
	emit_resources("subpass_inputs", res.subpass_inputs);
	emit_resources("inputs", res.stage_inputs);
	emit_resources("outputs", res.stage_outputs);
	emit_resources("textures", res.sampled_images);
	emit_resources("separate_images", res.separate_images);
	emit_resources("separate_samplers", res.separate_samplers);
	emit_resources("images", res.storage_images);
	emit_resources("ssbos", res.storage_buffers);
	emit_resources("ubos", res.uniform_buffers);
	emit_resources("push_constants", res.push_constant_buffers);
	emit_resources("counters", res.atomic_counters);
	emit_resources("acceleration_structures", res.acceleration_structures);
}